

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Const * __thiscall wasm::Builder::makeConst(Builder *this,Literal *value)

{
  bool bVar1;
  Const *pCVar2;
  Const *ret;
  Literal *value_local;
  Builder *this_local;
  
  bVar1 = Type::isNumber(&value->type);
  if (!bVar1) {
    __assert_fail("value.type.isNumber()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                  ,0x26b,"Const *wasm::Builder::makeConst(Literal)");
  }
  pCVar2 = MixedArena::alloc<wasm::Const>((MixedArena *)(this->wasm + 0x158));
  wasm::Literal::operator=(&pCVar2->value,value);
  (pCVar2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id =
       (value->type).id;
  return pCVar2;
}

Assistant:

Const* makeConst(Literal value) {
    assert(value.type.isNumber());
    auto* ret = wasm.allocator.alloc<Const>();
    ret->value = value;
    ret->type = value.type;
    return ret;
  }